

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O2

FT_Error sfnt_get_charset_id(TT_Face face,char **acharset_encoding,char **acharset_registry)

{
  FT_Error FVar1;
  BDF_PropertyRec registry;
  BDF_PropertyRec encoding;
  
  FVar1 = tt_face_find_bdf_prop(face,"CHARSET_REGISTRY",&registry);
  if (FVar1 == 0) {
    FVar1 = tt_face_find_bdf_prop(face,"CHARSET_ENCODING",&encoding);
    if (FVar1 == 0) {
      FVar1 = 6;
      if ((registry.type == BDF_PROPERTY_TYPE_ATOM) && (encoding.type == BDF_PROPERTY_TYPE_ATOM)) {
        *acharset_encoding = (char *)encoding.u;
        *acharset_registry = (char *)registry.u;
        FVar1 = 0;
      }
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  sfnt_get_charset_id( TT_Face       face,
                       const char*  *acharset_encoding,
                       const char*  *acharset_registry )
  {
    BDF_PropertyRec  encoding, registry;
    FT_Error         error;


    /* XXX: I don't know whether this is correct, since
     *      tt_face_find_bdf_prop only returns something correct if we have
     *      previously selected a size that is listed in the BDF table.
     *      Should we change the BDF table format to include single offsets
     *      for `CHARSET_REGISTRY' and `CHARSET_ENCODING'?
     */
    error = tt_face_find_bdf_prop( face, "CHARSET_REGISTRY", &registry );
    if ( !error )
    {
      error = tt_face_find_bdf_prop( face, "CHARSET_ENCODING", &encoding );
      if ( !error )
      {
        if ( registry.type == BDF_PROPERTY_TYPE_ATOM &&
             encoding.type == BDF_PROPERTY_TYPE_ATOM )
        {
          *acharset_encoding = encoding.u.atom;
          *acharset_registry = registry.u.atom;
        }
        else
          error = FT_THROW( Invalid_Argument );
      }
    }

    return error;
  }